

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

bool __thiscall
ArmParser::parseArmParameters
          (ArmParser *this,Parser *parser,tArmOpcode *opcode,ArmOpcodeVariables *vars)

{
  char cVar1;
  char symbol;
  bool bVar2;
  Token *pTVar3;
  int iVar4;
  ulong uVar5;
  ArmParser *this_00;
  char *pcVar6;
  char *pcVar7;
  ArmRegisterValue tempRegister;
  
  pcVar6 = opcode->mask;
  tempRegister.name._name._M_dataplus._M_p = (pointer)&tempRegister.name._name.field_2;
  tempRegister.name._name.field_2._M_allocated_capacity = 0;
  tempRegister.name._name.field_2._8_8_ = 0;
  tempRegister.name._name._M_string_length = 0;
  (vars->Shift).UseShift = false;
  (vars->Shift).UseFinal = false;
  vars->psr = false;
  vars->writeback = false;
  vars->SignPlus = false;
  (vars->Opcode).UseNewEncoding = false;
  (vars->Opcode).UseNewType = false;
  this_00 = this;
LAB_001543e6:
  do {
    cVar1 = *pcVar6;
    if (cVar1 == '\0') {
      pTVar3 = Parser::nextToken(parser);
      bVar2 = pTVar3->type == Separator;
      goto LAB_00154640;
    }
    uVar5 = (ulong)(cVar1 == '/');
    pcVar7 = pcVar6 + uVar5 + 1;
    symbol = pcVar7[-1];
    switch(symbol) {
    case 'D':
      bVar2 = parseCopRegister(this_00,parser,&(vars->CopData).cd);
      break;
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'J':
    case 'K':
    case 'L':
    case 'O':
    case 'Q':
    case 'T':
    case 'U':
    case 'V':
      goto switchD_0015441a_caseD_45;
    case 'I':
switchD_0015441a_caseD_49:
      this_00 = this;
      bVar2 = parseImmediate(this,parser,&vars->ImmediateExpression);
      iVar4 = 0x20;
      goto LAB_00154555;
    case 'M':
      bVar2 = parseCopRegister(this_00,parser,&(vars->CopData).cm);
      break;
    case 'N':
      bVar2 = parseCopRegister(this_00,parser,&(vars->CopData).cn);
      break;
    case 'P':
      bVar2 = parsePsrTransfer(this_00,parser,vars,*pcVar7 == '1');
      goto LAB_0015461e;
    case 'R':
      bVar2 = parseRegisterList(this_00,parser,&vars->rlist,0xffff);
      break;
    case 'S':
      this_00 = this;
      bVar2 = parseShift(this,parser,vars,*pcVar7 == '1');
      goto LAB_0015461e;
    case 'W':
      parseWriteback(this_00,parser,&vars->writeback);
      pcVar6 = pcVar7;
      goto LAB_001543e6;
    case 'X':
      bVar2 = parseCopNumber(this_00,parser,&(vars->CopData).pn);
      break;
    case 'Y':
      this_00 = this;
      bVar2 = parseImmediate(this,parser,&(vars->CopData).CpopExpression);
      iVar4 = 4;
      goto LAB_00154555;
    case 'Z':
      this_00 = this;
      bVar2 = parseImmediate(this,parser,&(vars->CopData).CpinfExpression);
      iVar4 = 3;
LAB_00154555:
      if (bVar2 == false) goto LAB_0015462d;
LAB_0015455e:
      vars->ImmediateBitLen = iVar4;
      pcVar6 = pcVar7;
      goto LAB_001543e6;
    default:
      switch(symbol) {
      case 'i':
        goto switchD_0015441a_caseD_49;
      case 'j':
        this_00 = this;
        bVar2 = parseImmediate(this,parser,&vars->ImmediateExpression);
        if (bVar2) {
          iVar4 = (int)pcVar6[uVar5 + 1];
          pcVar7 = pcVar6 + uVar5 + 2;
          goto LAB_0015455e;
        }
        goto LAB_0015462d;
      case 'k':
      case 'l':
      case 'o':
      case 'q':
      case 'r':
      case 't':
      case 'u':
      case 'w':
      case 'x':
      case 'y':
        goto switchD_0015441a_caseD_45;
      case 'm':
        bVar2 = parseRegister(this_00,parser,&vars->rm,*pcVar7 == '1' ^ 0xf);
        break;
      case 'n':
        bVar2 = parseRegister(this_00,parser,&vars->rn,*pcVar7 == '1' ^ 0xf);
        break;
      case 'p':
        parsePsr(this_00,parser,&vars->psr);
        pcVar6 = pcVar7;
        goto LAB_001543e6;
      case 's':
        bVar2 = parseRegister(this_00,parser,&vars->rs,*pcVar7 == '1' ^ 0xf);
        break;
      case 'v':
        parseSign(this_00,parser,&vars->SignPlus);
        pcVar6 = pcVar7;
        goto LAB_001543e6;
      case 'z':
        this_00 = this;
        bVar2 = parsePseudoShift(this,parser,vars,(int)*pcVar7);
        break;
      default:
        if (symbol == 'd') {
          bVar2 = parseRegister(this_00,parser,&vars->rd,*pcVar7 == '1' ^ 0xf);
          break;
        }
        goto switchD_0015441a_caseD_45;
      }
LAB_0015461e:
      pcVar7 = pcVar6 + uVar5 + 2;
    }
LAB_00154625:
    pcVar6 = pcVar7;
    if (bVar2 == false) {
LAB_0015462d:
      bVar2 = false;
LAB_00154640:
      std::__cxx11::string::~string((string *)&tempRegister);
      return bVar2;
    }
  } while( true );
switchD_0015441a_caseD_45:
  bVar2 = matchSymbol(this_00,parser,symbol,cVar1 == '/');
  goto LAB_00154625;
}

Assistant:

bool ArmParser::parseArmParameters(Parser& parser, const tArmOpcode& opcode, ArmOpcodeVariables& vars)
{
	const char* encoding = opcode.mask;

	ArmRegisterValue tempRegister;
	
	vars.Shift.UseShift = false;
	vars.Shift.UseFinal = false;
	vars.psr = false;
	vars.writeback = false;
	vars.SignPlus = false;
	vars.Opcode.UseNewEncoding = false;
	vars.Opcode.UseNewType = false;

	while (*encoding != 0)
	{
		bool optional = *encoding == '/';
		if (optional)
			encoding++;

		switch (*encoding++)
		{
		case 'd': // register
			CHECK(parseRegister(parser,vars.rd,*encoding++ == '1' ? 14 : 15));
			break;
		case 's': // register
			CHECK(parseRegister(parser,vars.rs,*encoding++ == '1' ? 14 : 15));
			break;
		case 'n': // register
			CHECK(parseRegister(parser,vars.rn,*encoding++ == '1' ? 14 : 15));
			break;
		case 'm': // register
			CHECK(parseRegister(parser,vars.rm,*encoding++ == '1' ? 14 : 15));
			break;
		case 'D': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cd));
			break;
		case 'N': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cn));
			break;
		case 'M': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cm));
			break;
		case 'W':	// writeback
			parseWriteback(parser,vars.writeback);
			break;
		case 'p':	// psr
			parsePsr(parser,vars.psr);
			break;
		case 'P':	// msr/mrs psr data
			CHECK(parsePsrTransfer(parser,vars,*encoding++ == '1'));
			break;
		case 'R':	// register list
			CHECK(parseRegisterList(parser,vars.rlist,0xFFFF));
			break;
		case 'S':	// shift
			CHECK(parseShift(parser,vars,*encoding++ == '1'));
			break;
		case 'I':	// immediate
		case 'i':
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = 32;
			break;
		case 'j':	// variable bit immediate
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = *encoding++;
			break;
		case 'X': // cop number
			CHECK(parseCopNumber(parser,vars.CopData.pn));
			break;
		case 'Y':	// cop opcode number
			CHECK(parseImmediate(parser,vars.CopData.CpopExpression));
			vars.ImmediateBitLen = 4;
			break;
		case 'Z':	// cop info number
			CHECK(parseImmediate(parser,vars.CopData.CpinfExpression));
			vars.ImmediateBitLen = 3;
			break;
		case 'z':	// shift for pseudo opcodes
			CHECK(parsePseudoShift(parser,vars,*encoding++));
			break;
		case 'v':	// sign for register index parameter
			parseSign(parser,vars.SignPlus);
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1),optional));
			break;
		}
	}

	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}